

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O3

void amrex::parser_ast_print(parser_node *node,string *space,AllPrint *printer)

{
  ostringstream *poVar1;
  ostringstream *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  parser_node_t pVar3;
  pointer pcVar4;
  parser_node *ppVar5;
  parser_node_t __val;
  uint uVar6;
  Print *pPVar7;
  ostream *poVar8;
  long *plVar9;
  uint uVar10;
  size_type *psVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  _Alloc_hider _Var15;
  uint uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  pcVar4 = (space->_M_dataplus)._M_p;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar4,pcVar4 + space->_M_string_length);
  std::__cxx11::string::append((char *)&local_1d8);
  pVar3 = node->type;
  switch(pVar3) {
  case PARSER_NUMBER:
    poVar8 = (ostream *)&(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"NUMBER: ",8);
    std::ostream::_M_insert<double>((double)node->l);
    goto LAB_00630b8f;
  case PARSER_SYMBOL:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"VARIABLE: ",10);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l);
    break;
  case PARSER_ADD:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,(space->_M_dataplus)._M_p,
               space->_M_string_length);
    lVar12 = 4;
    pcVar14 = "ADD\n";
    goto LAB_006308f5;
  case PARSER_SUB:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,(space->_M_dataplus)._M_p,
               space->_M_string_length);
    lVar12 = 4;
    pcVar14 = "SUB\n";
    goto LAB_006308f5;
  case PARSER_MUL:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,(space->_M_dataplus)._M_p,
               space->_M_string_length);
    lVar12 = 4;
    pcVar14 = "MUL\n";
    goto LAB_006308f5;
  case PARSER_DIV:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,(space->_M_dataplus)._M_p,
               space->_M_string_length);
    lVar12 = 4;
    pcVar14 = "DIV\n";
    goto LAB_006308f5;
  case PARSER_NEG:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    lVar12 = 8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NEG\n",4);
    goto LAB_00630914;
  case PARSER_F1:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    uVar16 = *(int *)&node->r - 1;
    if (uVar16 < 0x16) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,&DAT_0068014c + *(int *)(&DAT_0068014c + (ulong)uVar16 * 4),
                 *(long *)(&DAT_006801a8 + (ulong)uVar16 * 8));
    }
    else {
      poVar8 = OutStream();
      AllPrint::AllPrint((AllPrint *)local_1b8,poVar8);
      poVar8 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"parser_ast_print_f1: Unknown function ",0x26);
      std::ostream::operator<<(poVar8,*(int *)&node->r);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    ppVar5 = node->l;
    pcVar4 = (space->_M_dataplus)._M_p;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_1b8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar4,pcVar4 + space->_M_string_length);
    std::__cxx11::string::append(local_1b8);
    parser_ast_print(ppVar5,(string *)local_1b8,printer);
    local_1f8.field_2._M_allocated_capacity = local_1b8._16_8_;
    _Var15._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) goto LAB_00630ba3;
    goto LAB_00630e9d;
  case PARSER_F2:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    uVar16 = (node->lvp).ip - 1;
    if (uVar16 < 0xe) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,&DAT_00680258 + *(int *)(&DAT_00680258 + (ulong)uVar16 * 4),
                 *(long *)(&DAT_00680290 + (ulong)uVar16 * 8));
    }
    else {
      poVar8 = OutStream();
      AllPrint::AllPrint((AllPrint *)local_1b8,poVar8);
      poVar8 = (ostream *)(local_1b8 + 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"parser_ast_print_f2: Unknown function ",0x26);
      std::ostream::operator<<(poVar8,(node->lvp).ip);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    ppVar5 = node->l;
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_1b8 + 0x10);
    pcVar4 = (space->_M_dataplus)._M_p;
    local_1b8._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar4,pcVar4 + space->_M_string_length);
    std::__cxx11::string::append(local_1b8);
    parser_ast_print(ppVar5,(string *)local_1b8,printer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ != paVar2) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    ppVar5 = node->r;
    pcVar4 = (space->_M_dataplus)._M_p;
    local_1b8._0_8_ = paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b8,pcVar4,pcVar4 + space->_M_string_length);
    std::__cxx11::string::append(local_1b8);
    parser_ast_print(ppVar5,(string *)local_1b8,printer);
    local_1f8.field_2._M_allocated_capacity = local_1b8._16_8_;
    _Var15._M_p = (pointer)local_1b8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ == paVar2) goto LAB_00630ba3;
    goto LAB_00630e9d;
  case PARSER_F3:
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    pcVar4 = (space->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar4,pcVar4 + space->_M_string_length);
    std::__cxx11::string::append((char *)&local_1f8);
    if (node->rip == 0) {
      poVar1 = &(printer->super_Print).ss;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"IF\n",3);
    }
    else {
      local_1b8._8_8_ = OutStream();
      this = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(undefined4 *)(DAT_0071a620 + -0x48);
      local_1b8._0_4_ = 0xffffffff;
      std::__cxx11::ostringstream::ostringstream(this);
      *(undefined8 *)((long)auStack_1a0 + *(long *)(local_1b8._16_8_ - 0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"parser_ast_print_f3: Unknown function ",0x26);
      std::ostream::operator<<(this,node->rip);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    parser_ast_print(node->l,&local_1f8,printer);
    parser_ast_print(node->r,&local_1f8,printer);
    parser_ast_print((node->lvp).n,&local_1f8,printer);
    goto LAB_00630e8b;
  case PARSER_ASSIGN:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"=: ",3);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    lVar12 = 0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar7->ss," =\n",3);
    goto LAB_00630914;
  case PARSER_LIST:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,(space->_M_dataplus)._M_p,
               space->_M_string_length);
    lVar12 = 5;
    pcVar14 = "LIST\n";
LAB_006308f5:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&(printer->super_Print).ss,pcVar14,lVar12);
    lVar12 = 0x10;
    parser_ast_print(node->l,&local_1d8,printer);
LAB_00630914:
    parser_ast_print(*(parser_node **)((long)&node->type + lVar12),&local_1d8,printer);
    goto LAB_00630ba3;
  case PARSER_ADD_VP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ADD: ",5);
    std::ostream::_M_insert<double>((node->lvp).v);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->r->l);
    break;
  case PARSER_ADD_PP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"ADD: ",5);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar7->ss,"  ",2);
    pPVar7 = Print::operator<<(pPVar7,(char **)&node->r->l);
    break;
  case PARSER_SUB_VP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"SUB: ",5);
    std::ostream::_M_insert<double>((node->lvp).v);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->r->l);
    break;
  case PARSER_SUB_PP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"SUB: ",5);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar7->ss,"  ",2);
    pPVar7 = Print::operator<<(pPVar7,(char **)&node->r->l);
    break;
  case PARSER_MUL_VP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"MUL: ",5);
    std::ostream::_M_insert<double>((node->lvp).v);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->r->l);
    break;
  case PARSER_MUL_PP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"MUL: ",5);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar7->ss,"  ",2);
    pPVar7 = Print::operator<<(pPVar7,(char **)&node->r->l);
    break;
  case PARSER_DIV_VP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"DIV: ",5);
    std::ostream::_M_insert<double>((node->lvp).v);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ",1);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->r->l);
    break;
  case PARSER_DIV_PP:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"DIV: ",5);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPVar7->ss,"  ",2);
    pPVar7 = Print::operator<<(pPVar7,(char **)&node->r->l);
    break;
  case PARSER_NEG_P:
    poVar1 = &(printer->super_Print).ss;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(space->_M_dataplus)._M_p,space->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"NEG: ",5);
    pPVar7 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    break;
  default:
    __val = -pVar3;
    if (0 < (int)pVar3) {
      __val = pVar3;
    }
    uVar16 = 1;
    if (PARSER_F2 < __val) {
      uVar13 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar16 = uVar6;
        uVar10 = (uint)uVar13;
        if (uVar10 < 100) {
          uVar16 = uVar16 - 2;
          goto LAB_00630ddb;
        }
        if (uVar10 < 1000) {
          uVar16 = uVar16 - 1;
          goto LAB_00630ddb;
        }
        if (uVar10 < 10000) goto LAB_00630ddb;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar16 + 4;
      } while (99999 < uVar10);
      uVar16 = uVar16 + 1;
    }
LAB_00630ddb:
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)uVar16 - (char)((int)pVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1f8._M_dataplus._M_p + (pVar3 >> 0x1f),uVar16,__val);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,0x6803ef);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1b8._16_8_ = *psVar11;
      auStack_1a0[0] = plVar9[3];
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_1b8 + 0x10);
    }
    else {
      local_1b8._16_8_ = *psVar11;
      local_1b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_1b8._8_8_ = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Abort((string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
LAB_00630e8b:
    _Var15._M_p = local_1f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == &local_1f8.field_2) goto LAB_00630ba3;
LAB_00630e9d:
    operator_delete(_Var15._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    goto LAB_00630ba3;
  }
  poVar8 = (ostream *)&pPVar7->ss;
LAB_00630b8f:
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
LAB_00630ba3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
parser_ast_print (struct parser_node* node, std::string const& space, AllPrint& printer)
{
    std::string const& more_space = space + "  ";
    switch (node->type)
    {
    case PARSER_NUMBER:
        printer << space << "NUMBER: " << ((struct parser_number*)node)->value << "\n";
        break;
    case PARSER_SYMBOL:
        printer << space << "VARIABLE: " << ((struct parser_symbol*)node)->name << "\n";
        break;
    case PARSER_ADD:
        printer << space << "ADD\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_SUB:
        printer << space << "SUB\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_MUL:
        printer << space << "MUL\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_DIV:
        printer << space << "DIV\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_NEG:
        printer << space << "NEG\n";
        parser_ast_print(node->l, more_space, printer);
        break;
    case PARSER_F1:
        parser_ast_print_f1((struct parser_f1*)node, space, printer);
        break;
    case PARSER_F2:
        parser_ast_print_f2((struct parser_f2*)node, space, printer);
        break;
    case PARSER_F3:
        parser_ast_print_f3((struct parser_f3*)node, space, printer);
        break;
    case PARSER_ASSIGN:
        printer << space << "=: " << ((struct parser_assign*)node)->s->name << " =\n";
        parser_ast_print(((struct parser_assign*)node)->v, more_space, printer);
        break;
    case PARSER_LIST:
        printer << space <<"LIST\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_ADD_VP:
        printer << space << "ADD: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_VP:
        printer << space << "SUB: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_VP:
        printer << space << "MUL: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_VP:
        printer << space << "DIV: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_NEG_P:
        printer << space << "NEG: " << ((struct parser_symbol*)(node->l))->name << "\n";
        break;
    case PARSER_ADD_PP:
        printer << space << "ADD: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_PP:
        printer << space << "SUB: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_PP:
        printer << space << "MUL: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_PP:
        printer << space << "DIV: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
    }
}